

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_function.h
# Opt level: O1

bool __thiscall t_rs_generator::has_args(t_rs_generator *this,t_function *tfunc)

{
  t_struct *ptVar1;
  
  ptVar1 = tfunc->arglist_;
  if (ptVar1 != (t_struct *)0x0) {
    return (ptVar1->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           (ptVar1->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  }
  return false;
}

Assistant:

t_struct* get_arglist() const { return arglist_; }